

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mhap_parser_test.cpp
# Opt level: O0

void __thiscall
bioparser::test::BioparserMhapTest_CompressedParseWhole_Test::TestBody
          (BioparserMhapTest_CompressedParseWhole_Test *this)

{
  pointer pPVar1;
  vector<std::unique_ptr<bioparser::test::MhapOverlap,_std::default_delete<bioparser::test::MhapOverlap>_>,_std::allocator<std::unique_ptr<bioparser::test::MhapOverlap,_std::default_delete<bioparser::test::MhapOverlap>_>_>_>
  local_60;
  allocator local_31;
  string local_30;
  BioparserMhapTest_CompressedParseWhole_Test *local_10;
  BioparserMhapTest_CompressedParseWhole_Test *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_30,"sample.mhap.gz",&local_31);
  BioparserMhapTest::Setup(&this->super_BioparserMhapTest,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  pPVar1 = std::
           unique_ptr<bioparser::Parser<bioparser::test::MhapOverlap>,_std::default_delete<bioparser::Parser<bioparser::test::MhapOverlap>_>_>
           ::operator->(&(this->super_BioparserMhapTest).p);
  (*pPVar1->_vptr_Parser[2])(&local_60,pPVar1,0xffffffffffffffff,1);
  std::
  vector<std::unique_ptr<bioparser::test::MhapOverlap,_std::default_delete<bioparser::test::MhapOverlap>_>,_std::allocator<std::unique_ptr<bioparser::test::MhapOverlap,_std::default_delete<bioparser::test::MhapOverlap>_>_>_>
  ::operator=(&(this->super_BioparserMhapTest).o,&local_60);
  std::
  vector<std::unique_ptr<bioparser::test::MhapOverlap,_std::default_delete<bioparser::test::MhapOverlap>_>,_std::allocator<std::unique_ptr<bioparser::test::MhapOverlap,_std::default_delete<bioparser::test::MhapOverlap>_>_>_>
  ::~vector(&local_60);
  BioparserMhapTest::Check(&this->super_BioparserMhapTest);
  return;
}

Assistant:

TEST_F(BioparserMhapTest, CompressedParseWhole) {
  Setup("sample.mhap.gz");
  o = p->Parse(-1);
  Check();
}